

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx2::forward_int8_x86
          (Convolution_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  _func_int *p_Var6;
  size_t sVar7;
  size_t sVar8;
  Layer *pLVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  byte bVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  _func_int *p_Var29;
  _func_int **pp_Var30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  undefined8 *puVar41;
  uint uVar42;
  void *pvVar43;
  void *pvVar44;
  undefined8 *puVar45;
  int iVar46;
  int outw;
  int iVar47;
  uint uVar48;
  int iVar49;
  void *pvVar50;
  ulong uVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  int w;
  ulong local_220;
  void *local_210;
  float local_1fc;
  void *local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  int local_1dc;
  Mat *local_1d8;
  void *local_1d0;
  Option opt_q;
  ulong local_170;
  ulong local_168;
  float scale_out;
  Mat local_158;
  Mat local_108;
  long local_c0;
  long local_b8;
  void *local_b0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  Mat local_78;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  
  local_78.elempack = bottom_blob->elempack;
  local_78.elemsize = bottom_blob->elemsize;
  piVar5 = bottom_blob->refcount;
  local_78.data = bottom_blob->data;
  local_78.refcount = bottom_blob->refcount;
  local_78.allocator = bottom_blob->allocator;
  local_78.dims = bottom_blob->dims;
  local_78.w = bottom_blob->w;
  local_78.h = bottom_blob->h;
  local_78.d = bottom_blob->d;
  local_78.c = bottom_blob->c;
  local_78.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (local_78.elempack == 0 || ((int)local_78.elemsize * 8) / local_78.elempack != 8) {
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    uVar16 = opt->openmp_blocktime;
    uVar17 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.use_reserved_3 = opt->use_reserved_3;
    opt_q.use_reserved_4 = opt->use_reserved_4;
    opt_q.use_reserved_5 = opt->use_reserved_5;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.openmp_blocktime = uVar16;
    opt_q._28_4_ = uVar18;
    quantize_to_int8(bottom_blob,&local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86_avx2[-3]),&opt_q
                    );
  }
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86_avx2 + (long)this->_vptr_Convolution_x86_avx2[-3]),
             &local_78,&local_108,opt);
  iVar27 = local_108.elempack;
  iVar49 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((local_108.data == (void *)0x0) ||
     (opt_q.blob_allocator =
           (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     local_108.cstep * (long)local_108.c == 0)) goto LAB_00183130;
  p_Var29 = this->_vptr_Convolution_x86_avx2[-3];
  iVar46 = (~((*(int *)(p_Var29 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           local_108.w) / *(int *)(p_Var29 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data)
           + 1;
  iVar47 = (~((*(int *)(p_Var29 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           local_108.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var29) + 1;
  bVar24 = (*(uint *)(p_Var29 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) & 3) == 0 &
           opt->use_packing_layout;
  uVar48 = (uint)bVar24 + (uint)bVar24 * 2 + 1;
  local_1dc = *(int *)(p_Var29 + 0x18 + (long)&(this->weight_data_int8).data);
  uVar37 = ((uint)bVar24 + (uint)bVar24 * 2) * 4 + 4;
  uVar2 = uVar37;
  if (100 < local_1dc) {
    uVar2 = uVar48;
  }
  local_c0 = (long)local_108.c;
  Mat::create(top_blob,iVar46,iVar47,
              (int)*(uint *)(p_Var29 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) /
              (int)uVar48,(ulong)uVar2,uVar48,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    iVar49 = -100;
    goto LAB_00183130;
  }
  iVar49 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((long)top_blob->c * top_blob->cstep == 0) goto LAB_00183130;
  local_158.cstep = 0;
  local_158.data = (void *)0x0;
  local_158.refcount._0_4_ = 0;
  local_158.refcount._4_4_ = 0;
  local_158.elemsize = 0;
  local_158.elempack = 0;
  local_158.allocator = (Allocator *)0x0;
  local_158.dims = 0;
  local_158.w = 0;
  local_158.h = 0;
  local_158.d = 0;
  local_158.c = 0;
  Mat::create(&local_158,iVar46,iVar47,
              *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / (int)uVar48,(ulong)uVar37,
              uVar48,opt->workspace_allocator);
  iVar3 = local_108.c;
  iVar31 = local_108.w;
  iVar47 = local_158.h;
  iVar46 = local_158.w;
  iVar49 = -100;
  opt_q.blob_allocator =
       (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
  if ((local_158.data != (void *)0x0) &&
     (local_1d8 = (Mat *)(long)local_158.c,
     opt_q.blob_allocator =
          (Allocator *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_),
     local_158.cstep * (long)local_1d8 != 0)) {
    if (iVar27 == 8 && bVar24 == 1) {
      p_Var29 = this->_vptr_Convolution_x86_avx2[-3];
      uVar37 = *(uint *)(p_Var29 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if (((ulong)uVar37 == 1) &&
         (*(int *)(p_Var29 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) {
        if ((*(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1) &&
           (((*(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
             (*(int *)(p_Var29 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var29) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse(&local_108,&local_158,&this->weight_data_int8,opt);
        }
        else {
          if ((((*(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
               (*(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
              (*(int *)(p_Var29 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2)) ||
             (*(int *)((long)&this->convolution_dilation1 + (long)p_Var29) != 2)) goto LAB_00181a14;
          conv1x1s2_pack8to4_int8_sse(&local_108,&local_158,&this->weight_data_int8,opt);
        }
      }
      else {
LAB_00181a14:
        uVar2 = *(uint *)(p_Var29 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar49 = *(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        local_1f8 = (void *)(long)*(int *)(p_Var29 + 0x40 +
                                          (long)&(this->weight_data_3x3_winograd63).data);
        iVar4 = *(int *)(p_Var29 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        local_1f0 = (ulong)*(int *)((long)&this->convolution_dilation1 + (long)p_Var29);
        uVar35 = (ulong)(uint)local_108.c;
        uVar40 = (ulong)(uint)local_158.w;
        uVar51 = (ulong)(uint)local_158.h;
        if (opt->use_sgemm_convolution == true) {
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
          Mat::create((Mat *)&opt_q,local_158.h * local_158.w,uVar37 * uVar2,local_108.c,8,8,
                      opt->workspace_allocator);
          local_1d8 = &this->weight_data_int8;
          if (0 < iVar3) {
            iVar31 = iVar31 * (int)local_1f0;
            local_1d0 = local_108.data;
            local_1f0._0_1_ = opt_q.lightmode;
            local_1f0._1_3_ = opt_q._1_3_;
            local_1f0._4_4_ = opt_q.num_threads;
            local_1e8 = (long)local_108.w * (long)local_1f8;
            local_220 = 0;
            do {
              if (0 < (int)uVar2) {
                local_1f8 = (void *)(local_108.elemsize * local_1e8);
                uVar51 = 0;
                puVar45 = (undefined8 *)opt_q._0_8_;
                do {
                  if (0 < (int)uVar37) {
                    uVar28 = 0;
                    do {
                      if (0 < iVar47) {
                        puVar41 = (undefined8 *)
                                  ((long)local_108.data +
                                  uVar28 * (long)iVar49 * 8 +
                                  (long)local_1f8 * uVar51 +
                                  local_108.cstep * local_220 * local_108.elemsize);
                        uVar48 = 0;
                        do {
                          uVar36 = uVar40;
                          if (0 < iVar46) {
                            do {
                              *puVar45 = *puVar41;
                              puVar45 = puVar45 + 1;
                              puVar41 = puVar41 + iVar4;
                              uVar42 = (int)uVar36 - 1;
                              uVar36 = (ulong)uVar42;
                            } while (uVar42 != 0);
                          }
                          puVar41 = puVar41 + (iVar31 - iVar46 * iVar4);
                          uVar48 = uVar48 + 1;
                        } while (uVar48 != iVar47);
                      }
                      uVar28 = uVar28 + 1;
                    } while (uVar28 != uVar37);
                  }
                  uVar51 = uVar51 + 1;
                } while (uVar51 != uVar2);
              }
              local_220 = local_220 + 1;
            } while (local_220 != uVar35);
          }
          im2col_sgemm_pack8to4_int8_sse
                    ((Mat *)&opt_q,&local_158,local_1d8,(Option *)opt->workspace_allocator);
          piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (opt_q._32_8_ == 0) {
                if (opt_q._0_8_ != 0) {
                  free((void *)opt_q._0_8_);
                }
              }
              else {
                (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
              }
            }
          }
        }
        else {
          uVar48 = uVar37 * uVar2;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar48,
                     (allocator_type *)&local_1fc);
          if (0 < (int)uVar2) {
            iVar25 = 0;
            iVar26 = 0;
            uVar42 = 0;
            do {
              if (0 < (int)uVar37) {
                lVar38 = 0;
                do {
                  *(int *)(opt_q._0_8_ + (long)iVar25 * 4 + lVar38 * 4) = iVar26;
                  iVar26 = iVar26 + iVar49;
                  lVar38 = lVar38 + 1;
                } while (uVar37 != (uint)lVar38);
                iVar25 = iVar25 + (uint)lVar38;
              }
              iVar26 = iVar26 + (iVar31 * (int)local_1f8 - iVar49 * uVar37);
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar2);
          }
          if (0 < (int)local_1d8) {
            local_1d0 = (void *)((long)iVar46 * 4);
            local_220 = 0;
            do {
              if (0 < iVar47) {
                _w = (void *)(local_158.cstep * local_220 * local_158.elemsize +
                             (long)local_158.data);
                local_1e8 = 0;
                do {
                  if (0 < iVar46) {
                    local_1f8 = (void *)(local_1e8 * local_1f0);
                    uVar28 = 0;
                    do {
                      if (iVar3 < 1) {
                        auVar62 = (undefined1  [16])0x0;
                        auVar56 = (undefined1  [16])0x0;
                        auVar59 = (undefined1  [16])0x0;
                        auVar53 = (undefined1  [16])0x0;
                      }
                      else {
                        pvVar43 = (void *)((this->weight_data_int8).cstep * local_220 *
                                           (this->weight_data_int8).elemsize +
                                          (long)(this->weight_data_int8).data);
                        auVar55 = ZEXT1664((undefined1  [16])0x0);
                        uVar36 = 0;
                        auVar61 = ZEXT1664((undefined1  [16])0x0);
                        auVar60 = ZEXT1664((undefined1  [16])0x0);
                        auVar58 = ZEXT1664((undefined1  [16])0x0);
                        do {
                          if (0 < (int)uVar48) {
                            lVar38 = 0;
                            do {
                              auVar62._8_8_ = 0;
                              auVar62._0_8_ =
                                   *(ulong *)((long)local_108.data +
                                             (long)*(int *)(opt_q._0_8_ + lVar38) * 8 +
                                             local_108.cstep * local_108.elemsize * uVar36 +
                                             (long)(iVar4 * 8 * (int)uVar28) +
                                             (long)local_108.w * (long)local_1f8 *
                                             local_108.elemsize);
                              auVar53 = vpcmpgtb_avx((undefined1  [16])0x0,auVar62);
                              auVar15 = vpunpcklbw_avx(auVar62,auVar53);
                              auVar53 = *(undefined1 (*) [16])((long)pvVar43 + lVar38 * 8);
                              auVar62 = *(undefined1 (*) [16])((long)pvVar43 + lVar38 * 8 + 0x10);
                              auVar56 = vpcmpgtb_avx((undefined1  [16])0x0,auVar53);
                              auVar59 = vpcmpgtb_avx((undefined1  [16])0x0,auVar62);
                              auVar54 = vpunpcklbw_avx(auVar53,auVar56);
                              auVar53 = vpunpckhbw_avx(auVar53,auVar56);
                              auVar56 = vpunpcklbw_avx(auVar62,auVar59);
                              auVar62 = vpunpckhbw_avx(auVar62,auVar59);
                              auVar11 = vpmullw_avx(auVar54,auVar15);
                              auVar54 = vpmulhw_avx(auVar54,auVar15);
                              auVar12 = vpmullw_avx(auVar15,auVar53);
                              auVar57 = vpmulhw_avx(auVar15,auVar53);
                              auVar13 = vpmullw_avx(auVar56,auVar15);
                              auVar10 = vpmulhw_avx(auVar56,auVar15);
                              auVar14 = vpmullw_avx(auVar15,auVar62);
                              auVar15 = vpmulhw_avx(auVar15,auVar62);
                              auVar53 = vpunpcklwd_avx(auVar11,auVar54);
                              auVar53 = vpaddd_avx(auVar55._0_16_,auVar53);
                              auVar62 = vpunpcklwd_avx(auVar12,auVar57);
                              auVar62 = vpaddd_avx(auVar61._0_16_,auVar62);
                              auVar56 = vpunpcklwd_avx(auVar13,auVar10);
                              auVar56 = vpaddd_avx(auVar60._0_16_,auVar56);
                              auVar59 = vpunpcklwd_avx(auVar14,auVar15);
                              auVar59 = vpaddd_avx(auVar58._0_16_,auVar59);
                              auVar54 = vpunpckhwd_avx(auVar11,auVar54);
                              auVar53 = vpaddd_avx(auVar53,auVar54);
                              auVar55 = ZEXT1664(auVar53);
                              auVar53 = vpunpckhwd_avx(auVar12,auVar57);
                              auVar53 = vpaddd_avx(auVar62,auVar53);
                              auVar61 = ZEXT1664(auVar53);
                              auVar53 = vpunpckhwd_avx(auVar13,auVar10);
                              auVar53 = vpaddd_avx(auVar56,auVar53);
                              auVar60 = ZEXT1664(auVar53);
                              auVar53 = vpunpckhwd_avx(auVar14,auVar15);
                              auVar53 = vpaddd_avx(auVar59,auVar53);
                              auVar58 = ZEXT1664(auVar53);
                              lVar38 = lVar38 + 4;
                            } while ((ulong)uVar48 << 2 != lVar38);
                            pvVar43 = (void *)((long)pvVar43 + (ulong)uVar48 * 0x20);
                          }
                          auVar56 = auVar60._0_16_;
                          auVar62 = auVar58._0_16_;
                          auVar59 = auVar61._0_16_;
                          auVar53 = auVar55._0_16_;
                          uVar36 = uVar36 + 1;
                        } while (uVar36 != uVar35);
                      }
                      auVar54 = vpunpckldq_avx(auVar53,auVar59);
                      auVar57 = vpunpckldq_avx(auVar56,auVar62);
                      auVar59 = vpunpckhdq_avx(auVar53,auVar59);
                      auVar62 = vpunpckhdq_avx(auVar56,auVar62);
                      auVar56 = vpunpcklqdq_avx(auVar54,auVar57);
                      auVar53 = vpunpckhqdq_avx(auVar54,auVar57);
                      auVar53 = vpaddd_avx(auVar56,auVar53);
                      auVar56 = vpunpcklqdq_avx(auVar59,auVar62);
                      auVar62 = vpunpckhqdq_avx(auVar59,auVar62);
                      auVar62 = vpaddd_avx(auVar62,auVar56);
                      auVar53 = vpaddd_avx(auVar53,auVar62);
                      *(undefined1 (*) [16])((long)_w + uVar28 * 0x10) = auVar53;
                      uVar28 = uVar28 + 1;
                    } while (uVar28 != uVar40);
                  }
                  _w = (void *)((long)_w + (long)iVar46 * 0x10);
                  local_1e8 = local_1e8 + 1;
                } while (local_1e8 != uVar51);
              }
              local_220 = local_220 + 1;
            } while ((Mat *)local_220 != local_1d8);
          }
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
        }
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var30 = this->_vptr_Convolution_x86_avx2;
      p_Var6 = pp_Var30[-3];
      p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
      if (0 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar38 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var29 + 0x1f0) + lVar38 * 4);
          fVar52 = 0.0;
          if (fVar1 != 0.0) {
            fVar52 = 1.0 / (fVar1 * **(float **)(p_Var29 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar38 * 4) = fVar52;
          lVar38 = lVar38 + 1;
          p_Var6 = pp_Var30[-3];
          p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
        } while (lVar38 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1dc < 0x65) {
        dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x1a8),opt);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x280),
                   (Mat *)(p_Var29 + 0x1a8),*(int *)(p_Var29 + 0x10c),(Mat *)(p_Var29 + 0x110),opt);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar47 = local_108.c;
    iVar46 = local_108.w;
    iVar49 = local_158.w;
    if (iVar27 == 1 && bVar24 == 1) {
      p_Var29 = this->_vptr_Convolution_x86_avx2[-3];
      iVar31 = *(int *)(p_Var29 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar3 = *(int *)(p_Var29 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar4 = *(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar25 = *(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1f8 = (void *)(long)*(int *)(p_Var29 + 0x44 +
                                        (long)&(this->weight_data_3x3_winograd63).data);
      local_1f0 = (ulong)*(int *)((long)&this->convolution_dilation1 + (long)p_Var29);
      uVar51 = (ulong)(uint)local_108.c;
      lVar38 = (long)local_158.w;
      local_1e8 = (ulong)(uint)local_158.h;
      local_1d8 = (Mat *)(ulong)(uint)local_158.c;
      uVar37 = iVar31 * iVar3;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar37,
                 (allocator_type *)&local_1fc);
      if (0 < iVar3) {
        iVar26 = 0;
        iVar32 = 0;
        iVar33 = 0;
        do {
          if (0 < iVar31) {
            lVar39 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar26 * 4 + lVar39 * 4) = iVar32;
              iVar32 = iVar32 + iVar4;
              lVar39 = lVar39 + 1;
            } while (iVar31 != (int)lVar39);
            iVar26 = iVar26 + (int)lVar39;
          }
          iVar32 = iVar32 + (iVar46 * iVar25 - iVar4 * iVar31);
          iVar33 = iVar33 + 1;
        } while (iVar33 != iVar3);
      }
      if (0 < (int)local_1d8) {
        local_1d0 = (void *)(lVar38 * 4);
        _w = (void *)0x0;
        do {
          if (0 < (int)local_1e8) {
            pvVar43 = (void *)(local_158.cstep * (long)_w * local_158.elemsize +
                              (long)local_158.data);
            local_220 = 0;
            do {
              if (0 < iVar49) {
                lVar39 = 0;
                do {
                  if (iVar47 < 1) {
                    auVar53 = (undefined1  [16])0x0;
                  }
                  else {
                    pvVar50 = (void *)((this->weight_data_int8).cstep * (long)_w *
                                       (this->weight_data_int8).elemsize +
                                      (long)(this->weight_data_int8).data);
                    auVar55 = ZEXT1664((undefined1  [16])0x0);
                    uVar35 = 0;
                    do {
                      if (0 < (int)uVar37) {
                        uVar40 = 0;
                        do {
                          auVar56._0_2_ =
                               (short)*(char *)((long)local_108.data +
                                               (long)*(int *)(opt_q._0_8_ + uVar40 * 4) +
                                               local_108.cstep * local_108.elemsize * uVar35 +
                                               lVar39 * (long)local_1f8 +
                                               (long)local_108.w * local_220 * local_1f0 *
                                               local_108.elemsize);
                          auVar56._2_2_ = auVar56._0_2_;
                          auVar56._4_2_ = auVar56._0_2_;
                          auVar56._6_2_ = auVar56._0_2_;
                          auVar56._8_2_ = auVar56._0_2_;
                          auVar56._10_2_ = auVar56._0_2_;
                          auVar56._12_2_ = auVar56._0_2_;
                          auVar56._14_2_ = auVar56._0_2_;
                          auVar59._8_8_ = 0;
                          auVar59._0_8_ = *(ulong *)((long)pvVar50 + uVar40 * 4);
                          auVar53 = vpcmpgtb_avx((undefined1  [16])0x0,auVar59);
                          auVar53 = vpunpcklbw_avx(auVar59,auVar53);
                          auVar62 = vpmullw_avx(auVar56,auVar53);
                          auVar53 = vpmulhw_avx(auVar56,auVar53);
                          auVar53 = vpunpcklwd_avx(auVar62,auVar53);
                          auVar53 = vpaddd_avx(auVar55._0_16_,auVar53);
                          auVar55 = ZEXT1664(auVar53);
                          uVar40 = uVar40 + 1;
                        } while (uVar37 != uVar40);
                        pvVar50 = (void *)((long)pvVar50 + (ulong)uVar37 * 4);
                      }
                      auVar53 = auVar55._0_16_;
                      uVar35 = uVar35 + 1;
                    } while (uVar35 != uVar51);
                  }
                  *(undefined1 (*) [16])((long)pvVar43 + lVar39 * 0x10) = auVar53;
                  lVar39 = lVar39 + 1;
                } while (lVar39 != lVar38);
              }
              pvVar43 = (void *)((long)pvVar43 + lVar38 * 0x10);
              local_220 = local_220 + 1;
            } while (local_220 != local_1e8);
          }
          _w = (void *)((long)_w + 1);
        } while ((Mat *)_w != local_1d8);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var30 = this->_vptr_Convolution_x86_avx2;
      p_Var6 = pp_Var30[-3];
      p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
      if (0 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar38 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var29 + 0x1f0) + lVar38 * 4);
          fVar52 = 0.0;
          if (fVar1 != 0.0) {
            fVar52 = 1.0 / (fVar1 * **(float **)(p_Var29 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar38 * 4) = fVar52;
          lVar38 = lVar38 + 1;
          p_Var6 = pp_Var30[-3];
          p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
        } while (lVar38 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1dc < 0x65) {
        dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x1a8),opt);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x280),
                   (Mat *)(p_Var29 + 0x1a8),*(int *)(p_Var29 + 0x10c),(Mat *)(p_Var29 + 0x110),opt);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar31 = local_108.c;
    iVar47 = local_108.w;
    iVar46 = local_158.c;
    iVar49 = local_158.w;
    if ((iVar27 == 8) && (bVar24 != 1)) {
      p_Var29 = this->_vptr_Convolution_x86_avx2[-3];
      iVar3 = *(int *)(p_Var29 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar4 = *(int *)(p_Var29 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar25 = *(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar26 = *(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      local_1e8 = CONCAT44(local_1e8._4_4_,
                           *(undefined4 *)
                            (p_Var29 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data));
      local_1d8 = (Mat *)(long)*(int *)((long)&this->convolution_dilation1 + (long)p_Var29);
      uVar35 = (ulong)(uint)local_108.c;
      lVar38 = (long)local_158.w;
      local_1f0 = (ulong)(uint)local_158.h;
      uVar51 = (ulong)(uint)local_158.c;
      uVar37 = iVar3 * iVar4;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar37,
                 (allocator_type *)&local_1fc);
      if (0 < iVar4) {
        iVar32 = 0;
        iVar33 = 0;
        iVar34 = 0;
        do {
          if (0 < iVar3) {
            lVar39 = 0;
            do {
              *(int *)(opt_q._0_8_ + (long)iVar32 * 4 + lVar39 * 4) = iVar33;
              iVar33 = iVar33 + iVar25;
              lVar39 = lVar39 + 1;
            } while (iVar3 != (int)lVar39);
            iVar32 = iVar32 + (int)lVar39;
          }
          iVar33 = iVar33 + (iVar47 * iVar26 - iVar25 * iVar3);
          iVar34 = iVar34 + 1;
        } while (iVar34 != iVar4);
      }
      if (0 < iVar46) {
        local_b0 = local_158.data;
        local_b8 = local_158.elemsize * local_158.cstep;
        iVar46 = (int)local_1e8 * 8;
        local_1e8 = CONCAT44(local_1e8._4_4_,iVar46);
        local_168 = 0;
        do {
          if (0 < (int)local_1f0) {
            sVar7 = (this->weight_data_int8).cstep;
            sVar8 = (this->weight_data_int8).elemsize;
            pvVar43 = (void *)(local_b8 * local_168 + (long)local_158.data);
            pvVar50 = (this->weight_data_int8).data;
            local_1d0 = (void *)0x0;
            do {
              if (0 < iVar49) {
                local_1f8 = (void *)((long)local_1d0 * (long)local_1d8 * local_108.elemsize);
                lVar39 = 0;
                do {
                  if (iVar31 < 1) {
                    iVar47 = 0;
                  }
                  else {
                    uVar40 = 0;
                    iVar47 = 0;
                    pvVar44 = (void *)(sVar7 * local_168 * sVar8 + (long)pvVar50);
                    do {
                      if (0 < (int)uVar37) {
                        uVar28 = 0;
                        do {
                          auVar54._8_8_ = 0;
                          auVar54._0_8_ =
                               *(ulong *)((long)local_108.data +
                                         (long)*(int *)(opt_q._0_8_ + uVar28 * 4) * 8 +
                                         local_108.cstep * local_108.elemsize * uVar40 +
                                         (long)local_108.w * (long)local_1f8 +
                                         (long)(iVar46 * (int)lVar39));
                          auVar53 = vpcmpgtb_avx((undefined1  [16])0x0,auVar54);
                          auVar56 = vpunpcklbw_avx(auVar54,auVar53);
                          auVar57._8_8_ = 0;
                          auVar57._0_8_ = *(ulong *)((long)pvVar44 + uVar28 * 8);
                          auVar53 = vpcmpgtb_avx((undefined1  [16])0x0,auVar57);
                          auVar53 = vpunpcklbw_avx(auVar57,auVar53);
                          auVar62 = vpmullw_avx(auVar53,auVar56);
                          auVar53 = vpmulhw_avx(auVar56,auVar53);
                          auVar56 = vpunpcklwd_avx(auVar62,auVar53);
                          auVar53 = vpunpckhwd_avx(auVar62,auVar53);
                          auVar53 = vpaddd_avx(auVar56,auVar53);
                          auVar53 = vphaddd_avx(auVar53,auVar53);
                          auVar53 = vphaddd_avx(auVar53,auVar53);
                          iVar47 = iVar47 + auVar53._0_4_;
                          uVar28 = uVar28 + 1;
                        } while (uVar37 != uVar28);
                        pvVar44 = (void *)((long)pvVar44 + (ulong)uVar37 * 8);
                      }
                      uVar40 = uVar40 + 1;
                    } while (uVar40 != uVar35);
                  }
                  *(int *)((long)pvVar43 + lVar39 * 4) = iVar47;
                  lVar39 = lVar39 + 1;
                } while (lVar39 != lVar38);
              }
              pvVar43 = (void *)((long)pvVar43 + lVar38 * 4);
              local_1d0 = (void *)((long)local_1d0 + 1);
            } while (local_1d0 != (void *)local_1f0);
          }
          local_168 = local_168 + 1;
        } while (local_168 != uVar51);
      }
      if (opt_q._0_8_ != 0) {
        operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
      }
      opt_q.lightmode = false;
      opt_q._1_3_ = 0;
      opt_q.num_threads = 0;
      opt_q.blob_allocator._0_4_ = 0;
      opt_q.blob_allocator._4_4_ = 0;
      opt_q.workspace_allocator = (Allocator *)0x0;
      opt_q.openmp_blocktime = 0;
      opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
      opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
      Mat::create((Mat *)&opt_q,
                  *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                          (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var30 = this->_vptr_Convolution_x86_avx2;
      p_Var6 = pp_Var30[-3];
      p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
      if (0 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
        lVar38 = 0;
        do {
          fVar1 = *(float *)(*(long *)(p_Var29 + 0x1f0) + lVar38 * 4);
          fVar52 = 0.0;
          if (fVar1 != 0.0) {
            fVar52 = 1.0 / (fVar1 * **(float **)(p_Var29 + 0x238));
          }
          *(float *)(opt_q._0_8_ + lVar38 * 4) = fVar52;
          lVar38 = lVar38 + 1;
          p_Var6 = pp_Var30[-3];
          p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
        } while (lVar38 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data));
      }
      if (local_1dc < 0x65) {
        dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x1a8),opt);
        pLVar9 = this->activation;
        if (pLVar9 != (Layer *)0x0) {
          (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x280),
                   (Mat *)(p_Var29 + 0x1a8),*(int *)(p_Var29 + 0x10c),(Mat *)(p_Var29 + 0x110),opt);
      }
      piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (opt_q._32_8_ == 0) {
            if (opt_q._0_8_ != 0) {
              free((void *)opt_q._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
          }
        }
      }
    }
    iVar31 = local_108.c;
    iVar47 = local_158.c;
    iVar46 = local_158.w;
    iVar49 = 0;
    if (bVar24 == 0 && iVar27 == 1) {
      pp_Var30 = this->_vptr_Convolution_x86_avx2;
      if (((((opt->use_winograd_convolution == true) &&
            (p_Var29 = pp_Var30[-3],
            *(int *)(p_Var29 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var29 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
          ((*(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           (*(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         (((*(int *)(p_Var29 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           ((*(int *)((long)&this->convolution_dilation1 + (long)p_Var29) == 1 &&
            (0xf < iVar27 * (int)local_c0)))) &&
          (0xf < *(int *)(p_Var29 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))) {
        conv3x3s1_winograd23_int8_sse
                  (&local_108,&local_158,&this->weight_data_3x3_winograd23_int8,opt);
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q._32_28_ = ZEXT1228((undefined1  [12])0x0);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var30 = this->_vptr_Convolution_x86_avx2;
        p_Var6 = pp_Var30[-3];
        p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
        if (0 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar38 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var29 + 0x1f0) + lVar38 * 4);
            fVar52 = 0.0;
            if (fVar1 != 0.0) {
              fVar52 = 1.0 / (fVar1 * **(float **)(p_Var29 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar38 * 4) = fVar52;
            lVar38 = lVar38 + 1;
            p_Var6 = pp_Var30[-3];
            p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
          } while (lVar38 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)
                  );
        }
        if (local_1dc < 0x65) {
          dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x1a8),opt);
          pLVar9 = this->activation;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x280),
                     (Mat *)(p_Var29 + 0x1a8),*(int *)(p_Var29 + 0x10c),(Mat *)(p_Var29 + 0x110),opt
                    );
        }
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        p_Var29 = pp_Var30[-3];
        iVar27 = *(int *)(p_Var29 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        if ((((opt->use_sgemm_convolution == true) && (iVar27 == 1)) &&
            (iVar27 = 1,
            *(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) &&
           (*(uint *)(p_Var29 + 0x1c + (long)&(this->weight_data_int8).data) < 2)) {
          if (local_1dc < 0x65) {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)pp_Var30[-3]);
            if (0 < *(int *)(pp_Var30[-3] + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
            {
              lVar38 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var29 + 0x1f0) + lVar38 * 4);
                local_1fc = 0.0;
                if (fVar1 != 0.0) {
                  local_1fc = 1.0 / (fVar1 * **(float **)(p_Var29 + 0x238));
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_1fc);
                  pp_Var30 = this->_vptr_Convolution_x86_avx2;
                }
                else {
                  *(float *)opt_q.blob_allocator = local_1fc;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar38 = lVar38 + 1;
                p_Var29 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86_avx2 + (long)pp_Var30[-3]);
              } while (lVar38 < *(int *)(pp_Var30[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar27 = *(int *)(p_Var29 + 0xd4);
            iVar46 = *(int *)(p_Var29 + 0xd8);
            iVar47 = *(int *)(p_Var29 + 0xe4);
            iVar31 = *(int *)(p_Var29 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_dequant_sse
                      (&local_108,top_blob,*(Mat **)(p_Var29 + 0x160),iVar27,iVar46,iVar47,iVar31,
                       *(Mat **)(p_Var29 + 0x1a8),&local_a8,opt);
          }
          else {
            opt_q.lightmode = false;
            opt_q._1_3_ = 0;
            opt_q.num_threads = 0;
            opt_q.blob_allocator = (Allocator *)0x0;
            opt_q.workspace_allocator = (Allocator *)0x0;
            p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)pp_Var30[-3]);
            if (0 < *(int *)(pp_Var30[-3] + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))
            {
              lVar38 = 0;
              opt_q.blob_allocator = (Allocator *)(float *)0x0;
              do {
                fVar1 = *(float *)(*(long *)(p_Var29 + 0x1f0) + lVar38 * 4);
                local_1fc = 0.0;
                if (fVar1 != 0.0) {
                  local_1fc = 1.0 / (fVar1 * **(float **)(p_Var29 + 0x238));
                }
                scale_out = **(float **)(p_Var29 + 0x280);
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&local_1fc);
                }
                else {
                  *(float *)opt_q.blob_allocator = local_1fc;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                if (opt_q.blob_allocator == opt_q.workspace_allocator) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)&opt_q,
                             (iterator)opt_q.blob_allocator,&scale_out);
                }
                else {
                  *(float *)opt_q.blob_allocator = scale_out;
                  opt_q.blob_allocator = (Allocator *)((long)opt_q.blob_allocator + 4);
                }
                lVar38 = lVar38 + 1;
                p_Var29 = (_func_int *)
                          ((long)&this->_vptr_Convolution_x86_avx2 +
                          (long)this->_vptr_Convolution_x86_avx2[-3]);
              } while (lVar38 < *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                                        (long)&(this->weight_data_3x3_winograd63).data));
            }
            iVar27 = *(int *)(p_Var29 + 0xd4);
            iVar46 = *(int *)(p_Var29 + 0xd8);
            iVar47 = *(int *)(p_Var29 + 0xe4);
            iVar31 = *(int *)(p_Var29 + 0xe8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)&opt_q);
            conv_im2col_sgemm_int8_requant_sse
                      (&local_108,top_blob,*(Mat **)(p_Var29 + 0x160),iVar27,iVar46,iVar47,iVar31,
                       *(Mat **)(p_Var29 + 0x1a8),&local_90,opt);
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if (opt_q._0_8_ != 0) {
            operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
          }
          pLVar9 = this->activation;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
            iVar49 = 0;
          }
          goto LAB_001830f4;
        }
        iVar49 = *(int *)(p_Var29 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar3 = *(int *)(p_Var29 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar4 = *(int *)(p_Var29 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_1d0 = (void *)(long)*(int *)(p_Var29 + 0x44 +
                                          (long)&(this->weight_data_3x3_winograd63).data);
        iVar25 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var29);
        local_1f8 = (void *)CONCAT44(local_1f8._4_4_,local_108.w);
        uVar35 = (ulong)(uint)local_108.c;
        lVar38 = (long)local_158.w;
        local_1d8 = (Mat *)(ulong)(uint)local_158.h;
        uVar51 = (ulong)(uint)local_158.c;
        uVar37 = iVar49 * iVar3;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&opt_q,(long)(int)uVar37,
                   (allocator_type *)&local_1fc);
        if (0 < iVar3) {
          iVar26 = 0;
          iVar32 = 0;
          iVar33 = 0;
          do {
            if (0 < iVar49) {
              lVar39 = 0;
              do {
                *(int *)(opt_q._0_8_ + (long)iVar26 * 4 + lVar39 * 4) = iVar33;
                iVar33 = iVar33 + iVar27;
                lVar39 = lVar39 + 1;
              } while (iVar49 != (int)lVar39);
              iVar26 = iVar26 + (int)lVar39;
            }
            iVar33 = iVar33 + ((int)local_1f8 * iVar4 - iVar27 * iVar49);
            iVar32 = iVar32 + 1;
          } while (iVar32 != iVar3);
        }
        if (0 < iVar47) {
          local_b0 = local_158.data;
          local_b8 = local_158.elemsize * local_158.cstep;
          iVar27 = iVar31 * uVar37;
          local_c0 = CONCAT44(local_c0._4_4_,iVar27);
          local_170 = 0;
          do {
            if (0 < (int)local_1d8) {
              local_210 = (void *)(local_b8 * local_170 + (long)local_158.data);
              local_1e8 = (long)(iVar27 * (int)local_170) +
                          *(long *)(p_Var29 + 0x28 +
                                   (long)&(this->weight_data_3x3_winograd23_int8).data);
              local_1f0 = 0;
              do {
                if (0 < iVar46) {
                  local_1f8 = local_108.data;
                  lVar39 = 0;
                  do {
                    if (iVar31 < 1) {
                      iVar49 = 0;
                    }
                    else {
                      uVar28 = 0;
                      iVar49 = 0;
                      uVar40 = local_1e8;
                      do {
                        if (0 < (int)uVar37) {
                          uVar36 = 0;
                          do {
                            iVar49 = iVar49 + (int)*(char *)(uVar40 + uVar36) *
                                              (int)*(char *)((long)local_108.data +
                                                            (long)*(int *)(opt_q._0_8_ + uVar36 * 4)
                                                            + local_108.cstep * local_108.elemsize *
                                                              uVar28 + (long)local_108.w *
                                                                       local_1f0 * (long)iVar25 *
                                                                       local_108.elemsize +
                                                                       lVar39 * (long)local_1d0);
                            uVar36 = uVar36 + 1;
                          } while (uVar37 != uVar36);
                        }
                        uVar40 = uVar40 + (long)(int)uVar37;
                        uVar28 = uVar28 + 1;
                      } while (uVar28 != uVar35);
                    }
                    *(int *)((long)local_210 + lVar39 * 4) = iVar49;
                    lVar39 = lVar39 + 1;
                  } while (lVar39 != lVar38);
                }
                local_210 = (void *)((long)local_210 + lVar38 * 4);
                local_1f0 = local_1f0 + 1;
              } while ((Mat *)local_1f0 != local_1d8);
            }
            local_170 = local_170 + 1;
          } while (local_170 != uVar51);
        }
        if (opt_q._0_8_ != 0) {
          operator_delete((void *)opt_q._0_8_,(long)opt_q.workspace_allocator - opt_q._0_8_);
        }
        opt_q.lightmode = false;
        opt_q._1_3_ = 0;
        opt_q.num_threads = 0;
        opt_q.blob_allocator._0_4_ = 0;
        opt_q.blob_allocator._4_4_ = 0;
        opt_q.workspace_allocator = (Allocator *)0x0;
        opt_q.openmp_blocktime = 0;
        opt_q._32_12_ = SUB1612((undefined1  [16])0x0,0);
        opt_q._32_28_ = ZEXT1228((undefined1  [12])opt_q._32_12_);
        Mat::create((Mat *)&opt_q,
                    *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var30 = this->_vptr_Convolution_x86_avx2;
        p_Var6 = pp_Var30[-3];
        p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
        if (0 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)) {
          lVar38 = 0;
          do {
            fVar1 = *(float *)(*(long *)(p_Var29 + 0x1f0) + lVar38 * 4);
            fVar52 = 0.0;
            if (fVar1 != 0.0) {
              fVar52 = 1.0 / (fVar1 * **(float **)(p_Var29 + 0x238));
            }
            *(float *)(opt_q._0_8_ + lVar38 * 4) = fVar52;
            lVar38 = lVar38 + 1;
            p_Var6 = pp_Var30[-3];
            p_Var29 = (_func_int *)((long)&this->_vptr_Convolution_x86_avx2 + (long)p_Var6);
          } while (lVar38 < *(int *)(p_Var6 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data)
                  );
        }
        if (local_1dc < 0x65) {
          dequantize_from_int32(&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x1a8),opt);
          pLVar9 = this->activation;
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&local_158,top_blob,(Mat *)&opt_q,(Mat *)(p_Var29 + 0x280),
                     (Mat *)(p_Var29 + 0x1a8),*(int *)(p_Var29 + 0x10c),(Mat *)(p_Var29 + 0x110),opt
                    );
        }
        piVar5 = (int *)CONCAT44(opt_q.blob_allocator._4_4_,opt_q.blob_allocator._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (opt_q._32_8_ == 0) {
              if (opt_q._0_8_ != 0) {
                free((void *)opt_q._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
      iVar49 = 0;
    }
  }
LAB_001830f4:
  piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_158.allocator == (Allocator *)0x0) {
        if (local_158.data != (void *)0x0) {
          free(local_158.data);
        }
      }
      else {
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00183130:
  piVar5 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar49;
}

Assistant:

int Convolution_x86_avx2::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}